

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5StorageConfigValue(Fts5Storage *p,char *z,sqlite3_value *pVal,int iVal)

{
  int iVar1;
  int iVar2;
  uint in_ECX;
  long in_RDX;
  sqlite3_stmt *in_RSI;
  Fts5Index *in_RDI;
  long in_FS_OFFSET;
  int iNew;
  sqlite3_stmt *unaff_retaddr;
  int rc;
  sqlite3_stmt *pReplace;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  sqlite3_value *pValue;
  sqlite3_stmt *pStmt;
  
  pStmt = *(sqlite3_stmt **)(in_FS_OFFSET + 0x28);
  pValue = (sqlite3_value *)0x0;
  iVar1 = fts5StorageGetStmt((Fts5Storage *)pVal,iVal,(sqlite3_stmt **)unaff_retaddr,(char **)pStmt)
  ;
  if (iVar1 == 0) {
    sqlite3_bind_text(in_RSI,(int)((ulong)in_RDX >> 0x20),(char *)((ulong)in_ECX << 0x20),
                      in_stack_ffffffffffffffcc,(_func_void_void_ptr *)0x269d9f);
    if (in_RDX == 0) {
      sqlite3_bind_int((sqlite3_stmt *)CONCAT44(in_ECX,iVar1),in_stack_ffffffffffffffcc,
                       in_stack_ffffffffffffffc8);
    }
    else {
      sqlite3_bind_value(unaff_retaddr,(int)((ulong)pStmt >> 0x20),pValue);
    }
    sqlite3_step(pStmt);
    iVar1 = sqlite3_reset(in_RSI);
    sqlite3_bind_null((sqlite3_stmt *)CONCAT44(in_ECX,iVar1),in_stack_ffffffffffffffcc);
  }
  if ((iVar1 == 0) && (in_RDX != 0)) {
    iVar2 = in_RDI->pConfig->iCookie + 1;
    iVar1 = sqlite3Fts5IndexSetCookie(in_RDI,(int)((ulong)in_RSI >> 0x20));
    if (iVar1 == 0) {
      in_RDI->pConfig->iCookie = iVar2;
    }
  }
  if (*(sqlite3_stmt **)(in_FS_OFFSET + 0x28) != pStmt) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

static int sqlite3Fts5StorageConfigValue(
  Fts5Storage *p,
  const char *z,
  sqlite3_value *pVal,
  int iVal
){
  sqlite3_stmt *pReplace = 0;
  int rc = fts5StorageGetStmt(p, FTS5_STMT_REPLACE_CONFIG, &pReplace, 0);
  if( rc==SQLITE_OK ){
    sqlite3_bind_text(pReplace, 1, z, -1, SQLITE_STATIC);
    if( pVal ){
      sqlite3_bind_value(pReplace, 2, pVal);
    }else{
      sqlite3_bind_int(pReplace, 2, iVal);
    }
    sqlite3_step(pReplace);
    rc = sqlite3_reset(pReplace);
    sqlite3_bind_null(pReplace, 1);
  }
  if( rc==SQLITE_OK && pVal ){
    int iNew = p->pConfig->iCookie + 1;
    rc = sqlite3Fts5IndexSetCookie(p->pIndex, iNew);
    if( rc==SQLITE_OK ){
      p->pConfig->iCookie = iNew;
    }
  }
  return rc;
}